

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O2

DiyFp __thiscall DiyFp::operator*(DiyFp *this,DiyFp *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  DiyFp DVar7;
  
  uVar1 = this->f & 0xffffffff;
  uVar2 = this->f >> 0x20;
  uVar6 = rhs->f & 0xffffffff;
  uVar4 = rhs->f >> 0x20;
  uVar5 = uVar4 * uVar1;
  uVar3 = uVar2 * uVar6;
  DVar7.f = ((uVar5 & 0xffffffff) + (uVar3 & 0xffffffff) + (uVar6 * uVar1 >> 0x20) + 0x80000000 >>
            0x20) + (uVar5 >> 0x20) + (uVar3 >> 0x20) + uVar4 * uVar2;
  DVar7.e = rhs->e + this->e + 0x40;
  DVar7._12_4_ = 0;
  return DVar7;
}

Assistant:

DiyFp operator*(const DiyFp& rhs) const {
#if defined(_MSC_VER) && defined(_M_AMD64)
		uint64_t h;
		uint64_t l = _umul128(f, rhs.f, &h);
		if (l & (uint64_t(1) << 63)) // rounding
			h++;
		return DiyFp(h, e + rhs.e + 64);
#elif defined(__GNUC__) && (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 6)) && defined(__x86_64__)
        gcc_ints::uint128 p = static_cast<gcc_ints::uint128>(f) * static_cast<gcc_ints::uint128>(rhs.f);
		uint64_t h = p >> 64;
		uint64_t l = static_cast<uint64_t>(p);
		if (l & (uint64_t(1) << 63)) // rounding
			h++;
		return DiyFp(h, e + rhs.e + 64);
#else
		const uint64_t M32 = 0xFFFFFFFF;
		const uint64_t a = f >> 32;
		const uint64_t b = f & M32;
		const uint64_t c = rhs.f >> 32;
		const uint64_t d = rhs.f & M32;
		const uint64_t ac = a * c;
		const uint64_t bc = b * c;
		const uint64_t ad = a * d;
		const uint64_t bd = b * d;
		uint64_t tmp = (bd >> 32) + (ad & M32) + (bc & M32);
		tmp += 1U << 31;  /// mult_round
		return DiyFp(ac + (ad >> 32) + (bc >> 32) + (tmp >> 32), e + rhs.e + 64);
#endif
	}